

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_0::TriangleRenderer::getPrograms(SourceCollections *dst)

{
  SourceCollections *this;
  ProgramSources *pPVar1;
  allocator<char> local_109;
  string local_108;
  ShaderSource local_e8;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  ShaderSource local_70;
  allocator<char> local_31;
  string local_30;
  SourceCollections *local_10;
  SourceCollections *dst_local;
  
  local_10 = dst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"tri-vert",&local_31);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(push_constant) uniform FrameData\n{\n    highp uint frameNdx;\n} frameData;\nvoid main (void)\n{\n    highp float angle = float(frameData.frameNdx) / 100.0;\n    highp float c     = cos(angle);\n    highp float s     = sin(angle);\n    highp mat4  t     = mat4( c, -s,  0,  0,\n                              s,  c,  0,  0,\n                              0,  0,  1,  0,\n                              0,  0,  0,  1);\n    gl_Position = t * a_position;\n}\n"
             ,&local_91);
  glu::VertexSource::VertexSource((VertexSource *)&local_70,&local_90);
  glu::ProgramSources::operator<<(pPVar1,&local_70);
  glu::VertexSource::~VertexSource((VertexSource *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"tri-frag",&local_b9);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this->glslSources,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "#version 310 es\nlayout(location = 0) out lowp vec4 o_color;\nvoid main (void) { o_color = vec4(1.0, 0.0, 1.0, 1.0); }\n"
             ,&local_109);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_e8,&local_108);
  glu::ProgramSources::operator<<(pPVar1,&local_e8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void TriangleRenderer::getPrograms (SourceCollections& dst)
{
	dst.glslSources.add("tri-vert") << glu::VertexSource(
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(push_constant) uniform FrameData\n"
		"{\n"
		"    highp uint frameNdx;\n"
		"} frameData;\n"
		"void main (void)\n"
		"{\n"
		"    highp float angle = float(frameData.frameNdx) / 100.0;\n"
		"    highp float c     = cos(angle);\n"
		"    highp float s     = sin(angle);\n"
		"    highp mat4  t     = mat4( c, -s,  0,  0,\n"
		"                              s,  c,  0,  0,\n"
		"                              0,  0,  1,  0,\n"
		"                              0,  0,  0,  1);\n"
		"    gl_Position = t * a_position;\n"
		"}\n");
	dst.glslSources.add("tri-frag") << glu::FragmentSource(
		"#version 310 es\n"
		"layout(location = 0) out lowp vec4 o_color;\n"
		"void main (void) { o_color = vec4(1.0, 0.0, 1.0, 1.0); }\n");
}